

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFHelper.h
# Opt level: O0

void __thiscall Assimp::DXF::LineReader::~LineReader(LineReader *this)

{
  LineReader *this_local;
  
  std::__cxx11::string::~string((string *)&this->value);
  LineSplitter::~LineSplitter(&this->splitter);
  return;
}

Assistant:

LineReader(StreamReaderLE& reader)
    : splitter(reader,false,true)
    , groupcode( 0 )
    , value()
    , end() {
        // empty
    }